

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_to_uint64_array(roaring64_bitmap_t *r,uint64_t *out)

{
  roaring64_iterator_t it;
  uint64_t in_stack_ffffffffffffff78;
  uint64_t *in_stack_ffffffffffffff80;
  roaring64_iterator_t *in_stack_ffffffffffffff88;
  _Bool in_stack_ffffffffffffffd7;
  roaring64_iterator_t *in_stack_ffffffffffffffd8;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  roaring64_iterator_init_at
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  roaring64_iterator_read
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void roaring64_bitmap_to_uint64_array(const roaring64_bitmap_t *r,
                                      uint64_t *out) {
    roaring64_iterator_t it;  // gets initialized in the next line
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    roaring64_iterator_read(&it, out, UINT64_MAX);
}